

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void launch_test_thread<unsigned_short>
               (vector<std::thread,_std::allocator<std::thread>_> *test_threads)

{
  int iVar1;
  
  if (launch_test_thread<unsigned_short>(std::vector<std::thread,std::allocator<std::thread>>&)::
      max_threads == '\0') {
    iVar1 = __cxa_guard_acquire(&launch_test_thread<unsigned_short>(std::vector<std::thread,std::allocator<std::thread>>&)
                                 ::max_threads);
    if (iVar1 != 0) {
      launch_test_thread<unsigned_short>::max_threads = get_max_threads();
      __cxa_guard_release(&launch_test_thread<unsigned_short>(std::vector<std::thread,std::allocator<std::thread>>&)
                           ::max_threads);
    }
  }
  if ((long)(test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (ulong)launch_test_thread<unsigned_short>::max_threads) {
    wait_for_threads(test_threads);
    std::vector<std::thread,_std::allocator<std::thread>_>::clear(test_threads);
  }
  std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)()>
            ((vector<std::thread,std::allocator<std::thread>> *)test_threads,
             run_test<unsigned_short>);
  return;
}

Assistant:

void launch_test_thread(std::vector<std::thread> &test_threads) {
    static uint8_t max_threads = get_max_threads();

    if (max_threads == test_threads.size()) {
        wait_for_threads(test_threads);
        test_threads.clear();
    }
    test_threads.emplace_back(run_test<_IntT>);
}